

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O2

void __thiscall entities::Label::~Label(Label *this)

{
  uint tileIndex;
  Chunk *pCVar1;
  LodRenderer *pLVar2;
  repr coords;
  
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Label_0027b568;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Label_0027b5a0;
  spdlog::debug<char[33]>((char (*) [33])"Label entity has been destroyed.");
  pCVar1 = Entity::getChunk(&this->super_Entity);
  pLVar2 = Chunk::getLodRenderer(pCVar1);
  if (pLVar2 != (LodRenderer *)0x0) {
    pCVar1 = Entity::getChunk(&this->super_Entity);
    pLVar2 = Chunk::getLodRenderer(pCVar1);
    pCVar1 = Entity::getChunk(&this->super_Entity);
    coords = Chunk::getCoords(pCVar1);
    tileIndex = Entity::getIndex(&this->super_Entity);
    LodRenderer::removeDecoration(pLVar2,coords,tileIndex,&this->super_Drawable);
  }
  sf::Text::~Text(&this->text_);
  return;
}

Assistant:

Label::~Label() {
    spdlog::debug("Label entity has been destroyed.");
    if (getChunk().getLodRenderer() != nullptr) {
        getChunk().getLodRenderer()->removeDecoration(getChunk().getCoords(), getIndex(), this);
    }
}